

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vpu720.c
# Opt level: O0

MPP_RET hal_jpege_vpu720_gen_regs(void *hal,HalEncTask *task)

{
  void *__s;
  JpegeBits *bits_00;
  MppDev pvVar1;
  RK_S32 RVar2;
  uint uVar3;
  uint uVar4;
  RK_U32 RVar5;
  int iVar6;
  size_t sVar7;
  RK_U8 *buf_00;
  size_t sVar8;
  JpegeSyntax *syntax_00;
  void *__dest;
  RK_U32 encode_height;
  RK_U32 encode_width;
  RK_U32 j;
  RK_U32 i;
  RK_S32 bitpos;
  RK_U8 *qtbl_base;
  JpegeSyntax *syntax;
  size_t size;
  RK_U8 *buf;
  size_t length;
  RK_U8 *qtable [2];
  JpegeBits bits;
  JpegeVpu720BaseReg *reg_base;
  JpegeVpu720Reg *regs;
  JpegeVpu720HalCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  __s = *(void **)((long)hal + 0x70);
  bits_00 = *(JpegeBits **)((long)hal + 0xf0);
  memset(&length,0,0x10);
  sVar7 = mpp_packet_get_length(task->packet);
  buf_00 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  sVar8 = mpp_buffer_get_size_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  syntax_00 = (JpegeSyntax *)((long)hal + 0xf8);
  __dest = mpp_buffer_get_ptr_with_caller
                     (*(MppBuffer *)((long)hal + 0x1c0),"hal_jpege_vpu720_gen_regs");
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) enter\n","hal_jpege_vpu720_gen_regs",0x183);
  }
  jpege_vpu720_setup_format(hal,task);
  memset(__s,0,300);
  mpp_buffer_sync_begin_f(task->output,0,"hal_jpege_vpu720_gen_regs");
  jpege_bits_setup(bits_00,buf_00,(RK_S32)sVar8);
  jpege_seek_bits(bits_00,(RK_S32)(sVar7 << 3));
  write_jpeg_header(bits_00,syntax_00,(RK_U8 **)&length);
  mpp_buffer_sync_end_f(task->output,0,"hal_jpege_vpu720_gen_regs");
  RVar2 = jpege_bits_get_bitpos(bits_00);
  task->length = RVar2 + 7 >> 3;
  mpp_packet_set_length(task->packet,(ulong)task->length);
  *(uint *)((long)__s + 4) = *(uint *)((long)__s + 4) & 0xffffff00;
  *(uint *)((long)__s + 4) =
       *(uint *)((long)__s + 4) & 0xfffff0ff | (*(uint *)((long)hal + 0x88) & 0xf) << 8;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffffe | 1;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffffd | 2;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffffb | 4;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffff7 | 8;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xffffffef | 0x10;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xffffffdf | 0x20;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xffffffbf | 0x40;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xffffff7f | 0x80;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffeff | 0x100;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffdff | 0x200;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffffbff | 0x400;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xfffff7ff | 0x800;
  *(uint *)((long)__s + 0x10) = *(uint *)((long)__s + 0x10) & 0xffffefff | 0x1000;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffffe | 1;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffffd | 2;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffffb | 4;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffff7 | 8;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xffffffef | 0x10;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xffffffdf | 0x20;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xffffffbf | 0x40;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xffffff7f | 0x80;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffeff | 0x100;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffdff | 0x200;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffffbff | 0x400;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xfffff7ff | 0x800;
  *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xffffefff | 0x1000;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffffe | 1;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffffd | 2;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffffb | 4;
  *(ushort *)((long)__s + 0xa8) = *(ushort *)((long)__s + 0xa8) & 0xfff0 | 0xf;
  *(ushort *)((long)__s + 0xa8) = *(ushort *)((long)__s + 0xa8) & 0xff0f;
  *(ushort *)((long)__s + 0xa8) = *(ushort *)((long)__s + 0xa8) & 0xf0ff | 0xf00;
  *(ushort *)((long)__s + 0xa8) = *(ushort *)((long)__s + 0xa8) & 0xfff;
  *(int *)((long)__s + 0x2c) = *(int *)((long)hal + 0x110) * 1000;
  *(uint *)((long)__s + 0x68) = *(uint *)((long)__s + 0x68) & 0xfffffffe | 1;
  *(uint *)((long)__s + 0x68) = *(uint *)((long)__s + 0x68) & 0xfffffffd | 2;
  for (encode_width = 0; encode_width < 8; encode_width = encode_width + 1) {
    for (encode_height = 0; encode_height < 8; encode_height = encode_height + 1) {
      *(short *)(*(long *)((long)hal + 0x1c8) + (ulong)(encode_width * 8 + encode_height) * 2) =
           (short)(0x8000 / (ulong)(long)(int)(uint)*(byte *)(length + (encode_height * 8 +
                                                                       encode_width)));
      *(short *)(*(long *)((long)hal + 0x1c8) + (ulong)(encode_width * 8 + 0x40 + encode_height) * 2
                ) = (short)(0x8000 / (ulong)(long)(int)(uint)qtable[0][encode_height * 8 +
                                                                       encode_width]);
    }
  }
  memcpy((void *)(*(long *)((long)hal + 0x1c8) + 0x100),
         (void *)(*(long *)((long)hal + 0x1c8) + 0x80),0x80);
  uVar3 = (syntax_00->width + *(int *)((long)hal + 0x114)) - 1 &
          (*(int *)((long)hal + 0x114) - 1U ^ 0xffffffff);
  uVar4 = (*(int *)((long)hal + 0xfc) + *(int *)((long)hal + 0x118)) - 1U &
          (*(int *)((long)hal + 0x118) - 1U ^ 0xffffffff);
  *(uint *)((long)__s + 0x74) = *(uint *)((long)__s + 0x74) & 0xffffe000 | (uVar3 >> 3) - 1 & 0x1fff
  ;
  *(uint *)((long)__s + 0x74) =
       *(uint *)((long)__s + 0x74) & 0xe000ffff | ((uVar4 >> 3) - 1 & 0x1fff) << 0x10;
  *(uint *)((long)__s + 0x78) =
       *(uint *)((long)__s + 0x78) & 0xffffffc0 | uVar3 - syntax_00->width & 0x3f;
  *(uint *)((long)__s + 0x78) =
       *(uint *)((long)__s + 0x78) & 0xffc0ffff |
       (uVar4 - *(int *)((long)hal + 0xfc) & 0x3f) << 0x10;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xffffffc3 | (*(uint *)((long)hal + 0x98) & 0xf) << 2;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xffffff3f | (*(uint *)((long)hal + 0x9c) & 3) << 6;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xfffffffd | (*(uint *)((long)hal + 0xac) & 1) << 1;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xfffff7ff | (*(uint *)((long)hal + 0xa8) & 1) << 0xb;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xffff7fff | (*(uint *)((long)hal + 0xb0) & 1) << 0xf;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xffffefff | (*(uint *)((long)hal + 0xb4) & 1) << 0xc;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xff00ffff | (*(uint *)((long)hal + 0xb8) & 0xff) << 0x10;
  *(uint *)((long)__s + 0x80) =
       *(uint *)((long)__s + 0x80) & 0xffffff | *(int *)((long)hal + 0xbc) << 0x18;
  if (*(int *)((long)hal + 0xa0) != *(int *)((long)hal + 0xa4)) {
    *(uint *)((long)__s + 0x80) = *(uint *)((long)__s + 0x80) & 0xfffffdff | 0x200;
    if (*(int *)((long)hal + 0xa0) == 1) {
      *(uint *)((long)__s + 0x80) = *(uint *)((long)__s + 0x80) & 0xfffffbff | 0x400;
    }
    else {
      *(uint *)((long)__s + 0x80) = *(uint *)((long)__s + 0x80) & 0xfffffbff;
    }
  }
  RVar5 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)__s + 0x84) = *(uint *)((long)__s + 0x84) & 0xffff0000 | RVar5 & 0xffff;
  RVar5 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)__s + 0x84) = *(uint *)((long)__s + 0x84) & 0xffff | RVar5 << 0x10;
  *(uint *)((long)__s + 0x88) =
       *(uint *)((long)__s + 0x88) & 0xfff00000 | *(uint *)((long)hal + 0xc4) & 0xfffff;
  *(uint *)((long)__s + 0x8c) =
       *(uint *)((long)__s + 0x8c) & 0xfff80000 | *(uint *)((long)hal + 200) & 0x7ffff;
  *(uint *)((long)__s + 0x90) =
       *(uint *)((long)__s + 0x90) & 0xffff0000 | *(uint *)((long)hal + 0x198) & 0xffff;
  *(uint *)((long)__s + 0x90) = *(uint *)((long)__s + 0x90) & 0xe3ffffff;
  *(uint *)((long)__s + 0x90) = *(uint *)((long)__s + 0x90) & 0xdfffffff | 0x20000000;
  iVar6 = mpp_buffer_get_fd_with_caller(task->input,"hal_jpege_vpu720_gen_regs");
  *(int *)((long)__s + 0x58) = iVar6;
  *(undefined4 *)((long)__s + 0x5c) = *(undefined4 *)((long)__s + 0x58);
  *(undefined4 *)((long)__s + 0x60) = *(undefined4 *)((long)__s + 0x58);
  iVar6 = mpp_buffer_get_fd_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  *(int *)((long)__s + 0x44) = iVar6;
  *(undefined4 *)((long)__s + 0x48) = *(undefined4 *)((long)__s + 0x44);
  *(undefined4 *)((long)__s + 0x4c) = *(undefined4 *)((long)__s + 0x44);
  *(undefined4 *)((long)__s + 0x50) = *(undefined4 *)((long)__s + 0x44);
  iVar6 = mpp_buffer_get_fd_with_caller
                    (*(MppBuffer *)((long)hal + 0x1c0),"hal_jpege_vpu720_gen_regs");
  *(int *)((long)__s + 0x40) = iVar6;
  memcpy(__dest,*(void **)((long)hal + 0x1c8),0x180);
  mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x1c0),0,"hal_jpege_vpu720_gen_regs");
  pvVar1 = *(MppDev *)((long)hal + 0x68);
  sVar7 = mpp_packet_get_length(task->packet);
  mpp_dev_set_reg_offset(pvVar1,0x14,(RK_U32)sVar7);
  pvVar1 = *(MppDev *)((long)hal + 0x68);
  sVar7 = mpp_buffer_get_size_with_caller(task->output,"hal_jpege_vpu720_gen_regs");
  mpp_dev_set_reg_offset(pvVar1,0x11,(RK_U32)sVar7);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x68),0x17,*(RK_U32 *)((long)hal + 0xcc));
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x68),0x18,*(RK_U32 *)((long)hal + 0xd0));
  *(int *)((long)hal + 0xec) = *(int *)((long)hal + 0xec) + 1;
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) leave\n","hal_jpege_vpu720_gen_regs",0x201);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vpu720_gen_regs(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    JpegeVpu720HalCtx *ctx = (JpegeVpu720HalCtx *) hal;
    JpegeVpu720Reg *regs = ctx->regs;
    JpegeVpu720BaseReg *reg_base = &regs->reg_base;
    JpegeBits bits = ctx->bits;
    const RK_U8 *qtable[2] = {NULL};
    size_t length = mpp_packet_get_length(task->packet);
    RK_U8 *buf = mpp_buffer_get_ptr(task->output);
    size_t size = mpp_buffer_get_size(task->output);
    JpegeSyntax *syntax = &ctx->syntax;
    RK_U8 *qtbl_base = (RK_U8 *)mpp_buffer_get_ptr(ctx->qtbl_buffer);
    RK_S32 bitpos;
    RK_U32 i, j;
    RK_U32 encode_width;
    RK_U32 encode_height;

    hal_jpege_enter();

    jpege_vpu720_setup_format(hal, task);

    memset(regs, 0, sizeof(JpegeVpu720Reg));

    mpp_buffer_sync_begin(task->output);
    jpege_bits_setup(bits, buf, (RK_U32)size);
    jpege_seek_bits(bits, length << 3);
    write_jpeg_header(bits, syntax, qtable);
    mpp_buffer_sync_end(task->output);

    bitpos = jpege_bits_get_bitpos(bits);
    task->length = (bitpos + 7) >> 3;

    mpp_packet_set_length(task->packet, task->length);

    reg_base->reg001_enc_strt.lkt_num = 0;
    reg_base->reg001_enc_strt.vepu_cmd = ctx->enc_mode;

    // interupt
    reg_base->reg004_int_en.fenc_done_en = 1;
    reg_base->reg004_int_en.lkt_node_done_en = 1;
    reg_base->reg004_int_en.sclr_done_en = 1;
    reg_base->reg004_int_en.vslc_done_en = 1;
    reg_base->reg004_int_en.vbsb_oflw_en = 1;
    reg_base->reg004_int_en.vbsb_sct_en = 1;
    reg_base->reg004_int_en.fenc_err_en = 1;
    reg_base->reg004_int_en.wdg_en = 1;
    reg_base->reg004_int_en.lkt_oerr_en = 1;
    reg_base->reg004_int_en.lkt_estp_en = 1;
    reg_base->reg004_int_en.lkt_fstp_en = 1;
    reg_base->reg004_int_en.lkt_note_stp_en = 1;
    reg_base->reg004_int_en.lkt_data_error_en = 1;

    reg_base->reg005_int_msk.fenc_done_msk = 1;
    reg_base->reg005_int_msk.lkt_node_done_msk = 1;
    reg_base->reg005_int_msk.sclr_done_msk = 1;
    reg_base->reg005_int_msk.vslc_done_msk = 1;
    reg_base->reg005_int_msk.vbsb_oflw_msk = 1;
    reg_base->reg005_int_msk.vbsb_sct_msk = 1;
    reg_base->reg005_int_msk.fenc_err_msk = 1;
    reg_base->reg005_int_msk.wdg_msk = 1;
    reg_base->reg005_int_msk.lkt_oerr_msk = 1;
    reg_base->reg005_int_msk.lkt_estp_msk = 1;
    reg_base->reg005_int_msk.lkt_fstp_msk = 1;
    reg_base->reg005_int_msk.lkt_note_stp_msk = 1;
    reg_base->reg005_int_msk.lkt_data_error_msk = 1;

    reg_base->reg008_cru_ctrl.resetn_hw_en = 1;
    reg_base->reg008_cru_ctrl.sram_ckg_en = 1;
    reg_base->reg008_cru_ctrl.cke = 1;

    reg_base->reg042_dbus_endn.jbsw_bus_edin = 0xf;
    reg_base->reg042_dbus_endn.vsl_bus_edin = 0;
    reg_base->reg042_dbus_endn.ecs_len_edin = 0xf;
    reg_base->reg042_dbus_endn.sw_qtbl_edin = 0;

    reg_base->reg011_wdg_jpeg = syntax->mcu_cnt * 1000;

    reg_base->reg026_axi_perf_ctrl0.perf_work_e = 1;
    reg_base->reg026_axi_perf_ctrl0.perf_clr_e = 1;

    for (i = 0; i < 8; i++) {
        for (j = 0; j < 8; j++) {
            ctx->qtbl_sw_buf[i * 8 + j] = 0x8000 / qtable[0][j * 8 + i];
            ctx->qtbl_sw_buf[64 + i * 8 + j] = 0x8000 / qtable[1][j * 8 + i];
        }
    }

    memcpy(&ctx->qtbl_sw_buf[64 * 2], &ctx->qtbl_sw_buf[64], sizeof(RK_U16) * 64);

    encode_width = MPP_ALIGN(syntax->width, syntax->mcu_width);
    encode_height = MPP_ALIGN(syntax->height, syntax->mcu_height);
    reg_base->reg029_sw_enc_rsl.pic_wd8_m1 = encode_width / 8 - 1;
    reg_base->reg029_sw_enc_rsl.pic_hd8_m1 = encode_height / 8 - 1;
    reg_base->reg030_sw_src_fill.pic_wfill_jpeg = encode_width - syntax->width;
    reg_base->reg030_sw_src_fill.pic_hfill_jpeg = encode_height - syntax->height;

    reg_base->reg032_sw_src_fmt.src_fmt = ctx->fmt_cfg.input_format;
    reg_base->reg032_sw_src_fmt.out_fmt = ctx->fmt_cfg.out_format;
    reg_base->reg032_sw_src_fmt.rbuv_swap_jpeg = ctx->fmt_cfg.uv_swap;
    reg_base->reg032_sw_src_fmt.chroma_ds_mode = ctx->fmt_cfg.chroma_ds_mode;
    reg_base->reg032_sw_src_fmt.src_mirr_jpeg = ctx->fmt_cfg.mirror;
    reg_base->reg032_sw_src_fmt.chroma_force_en = ctx->fmt_cfg.fix_chroma_en;
    reg_base->reg032_sw_src_fmt.u_force_value = ctx->fmt_cfg.fix_chroma_u;
    reg_base->reg032_sw_src_fmt.v_force_value = ctx->fmt_cfg.fix_chroma_v;

    if (ctx->fmt_cfg.src_range != ctx->fmt_cfg.dst_range) {
        reg_base->reg032_sw_src_fmt.src_range_trns_en = 1;
        if (ctx->fmt_cfg.src_range == MPP_FRAME_RANGE_MPEG)
            reg_base->reg032_sw_src_fmt.src_range_trns_sel = JPEG_VPU720_COLOR_RANGE_LIMIT_TO_FULL;
        else
            reg_base->reg032_sw_src_fmt.src_range_trns_sel = JPEG_VPU720_COLOR_RANGE_FULL_TO_LIMIT;
    }

    reg_base->reg033_sw_pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
    reg_base->reg033_sw_pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);

    reg_base->reg034_sw_src_strd_0.src_strd_0 = ctx->fmt_cfg.y_stride;
    reg_base->reg035_sw_src_strd_1.src_strd_1 = ctx->fmt_cfg.uv_stride;

    reg_base->reg036_sw_jpeg_enc_cfg.rst_intv = syntax->restart_ri;
    reg_base->reg036_sw_jpeg_enc_cfg.rst_m = 0;
    reg_base->reg036_sw_jpeg_enc_cfg.pic_last_ecs = 1;

    reg_base->reg022_adr_src0 = mpp_buffer_get_fd(task->input);
    reg_base->reg023_adr_src1 = reg_base->reg022_adr_src0;
    reg_base->reg024_adr_src2 = reg_base->reg022_adr_src0;

    reg_base->reg017_adr_bsbt = mpp_buffer_get_fd(task->output);
    reg_base->reg018_adr_bsbb = reg_base->reg017_adr_bsbt;
    reg_base->reg019_adr_bsbr = reg_base->reg017_adr_bsbt;
    reg_base->reg020_adr_bsbs = reg_base->reg017_adr_bsbt;

    reg_base->reg016_adr_qtbl = mpp_buffer_get_fd(ctx->qtbl_buffer);
    memcpy(qtbl_base, ctx->qtbl_sw_buf, JPEGE_VPU720_QTABLE_SIZE * sizeof(RK_U16));
    mpp_buffer_sync_end(ctx->qtbl_buffer);

    mpp_dev_set_reg_offset(ctx->dev, 20, mpp_packet_get_length(task->packet));
    mpp_dev_set_reg_offset(ctx->dev, 17, mpp_buffer_get_size(task->output));
    mpp_dev_set_reg_offset(ctx->dev, 23, ctx->fmt_cfg.u_offset);
    mpp_dev_set_reg_offset(ctx->dev, 24, ctx->fmt_cfg.v_offset);

    ctx->frame_num++;

    hal_jpege_leave();
    return ret;
}